

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.c
# Opt level: O2

LY_ERR lyd_validate_all(lyd_node **tree,ly_ctx *ctx,uint32_t val_opts,lyd_node **diff)

{
  lyd_node *plVar1;
  LY_ERR LVar2;
  ly_ctx *ctx_00;
  char *pcVar3;
  lys_module *plVar4;
  
  if (tree == (lyd_node **)0x0) {
    pcVar3 = "tree";
LAB_001aa967:
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).",pcVar3,"lyd_validate_all")
    ;
    return LY_EINVAL;
  }
  plVar1 = *tree;
  if (ctx == (ly_ctx *)0x0 && plVar1 == (lyd_node *)0x0) {
    pcVar3 = "*tree || ctx";
    goto LAB_001aa967;
  }
  if (plVar1 == (lyd_node *)0x0) {
LAB_001aa998:
    if (ctx == (ly_ctx *)0x0) {
      if (plVar1->schema == (lysc_node *)0x0) {
        plVar4 = (lys_module *)&plVar1[2].schema;
      }
      else {
        plVar4 = plVar1->schema->module;
      }
      ctx = plVar4->ctx;
    }
  }
  else {
    if (plVar1->schema == (lysc_node *)0x0) {
      ctx_00 = (ly_ctx *)plVar1[2].schema;
      if (ctx_00 == (ly_ctx *)0x0 || ctx == (ly_ctx *)0x0) goto LAB_001aa998;
    }
    else if ((ctx == (ly_ctx *)0x0) ||
            (ctx_00 = plVar1->schema->module->ctx, ctx_00 == (ly_ctx *)0x0)) goto LAB_001aa998;
    if (ctx_00 != ctx) {
      ly_log(ctx_00,LY_LLERR,LY_EINVAL,"Different contexts mixed in a single function call.");
      return LY_EINVAL;
    }
  }
  if (diff != (lyd_node **)0x0) {
    *diff = (lyd_node *)0x0;
  }
  LVar2 = lyd_validate(tree,(lys_module *)0x0,ctx,val_opts,'\x01',(ly_set *)0x0,(ly_set *)0x0,
                       (ly_set *)0x0,(ly_set *)0x0,(ly_set *)0x0,diff);
  return LVar2;
}

Assistant:

LIBYANG_API_DEF LY_ERR
lyd_validate_all(struct lyd_node **tree, const struct ly_ctx *ctx, uint32_t val_opts, struct lyd_node **diff)
{
    LY_CHECK_ARG_RET(NULL, tree, *tree || ctx, LY_EINVAL);
    LY_CHECK_CTX_EQUAL_RET(*tree ? LYD_CTX(*tree) : NULL, ctx, LY_EINVAL);
    if (!ctx) {
        ctx = LYD_CTX(*tree);
    }
    if (diff) {
        *diff = NULL;
    }

    return lyd_validate(tree, NULL, ctx, val_opts, 1, NULL, NULL, NULL, NULL, NULL, diff);
}